

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

Roaring64Map * __thiscall roaring::Roaring64Map::operator^=(Roaring64Map *this,Roaring64Map *other)

{
  _Bool _Var1;
  const_iterator __position;
  _Rb_tree_node_base *p_Var2;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>,_bool> pVar3;
  
  if (this == other) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
    ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
             *)this);
  }
  else {
    for (p_Var2 = (other->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(other->roarings)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      pVar3 = std::
              _Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
              ::_M_insert_unique<std::pair<unsigned_int_const,roaring::Roaring>const&>
                        ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,roaring::Roaring>,std::_Select1st<std::pair<unsigned_int_const,roaring::Roaring>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,roaring::Roaring>>>
                          *)this,(pair<const_unsigned_int,_roaring::Roaring> *)(p_Var2 + 1));
      __position._M_node = (_Base_ptr)pVar3.first._M_node;
      if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        roaring_bitmap_xor_inplace
                  ((roaring_bitmap_t *)&__position._M_node[1]._M_parent,
                   (roaring_bitmap_t *)&p_Var2[1]._M_parent);
        _Var1 = roaring_bitmap_is_empty((roaring_bitmap_t *)&__position._M_node[1]._M_parent);
        if (_Var1) {
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          ::_M_erase_aux((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                          *)this,__position);
        }
      }
      else {
        *(byte *)&__position._M_node[2]._M_parent =
             *(byte *)&__position._M_node[2]._M_parent & 0xfe | this->copyOnWrite;
      }
    }
  }
  return this;
}

Assistant:

Roaring64Map &operator^=(const Roaring64Map &other) {
        if (this == &other) {
            // XORing *this with itself results in the empty map.
            roarings.clear();
            return *this;
        }

        // Logic table summarizing what to do when a given outer key is
        // present vs. absent from self and other.
        //
        // self     other    (self ^ other)  work to do
        // --------------------------------------------
        // absent   absent   empty           None
        // absent   present  non-empty       Copy other to self and set flags
        // present  absent   unchanged       None
        // present  present  empty or not    XOR other into self, but erase self
        //                                   if result is empty.
        //
        // Because there is only work to do when a key is present in 'other',
        // the main for loop iterates over entries in 'other'.

        for (const auto &other_entry : other.roarings) {
            const auto &other_bitmap = other_entry.second;

            // Try to insert other_bitmap into self at other_key. We take
            // advantage of the fact that std::map::insert will not overwrite an
            // existing entry.
            auto insert_result = roarings.insert(other_entry);
            auto self_iter = insert_result.first;
            auto insert_happened = insert_result.second;
            auto &self_bitmap = self_iter->second;

            if (insert_happened) {
                // Key was not present in self, so insert was performed above.
                // In the logic table above, this reflects the case
                // (self.absent ^ other.present). Because the copy has already
                // happened, thanks to the 'insert' operation above, we just
                // need to set the copyOnWrite flag.
                self_bitmap.setCopyOnWrite(copyOnWrite);
                continue;
            }

            // Both sides have self_key, and the insert was not performed. In
            // the logic table above, this reflects the case
            // (self.present ^ other.present). So XOR other into self.
            self_bitmap ^= other_bitmap;

            if (self_bitmap.isEmpty()) {
                // ...but if intersection is empty, remove it altogether.
                roarings.erase(self_iter);
            }
        }
        return *this;
    }